

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereSphereCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSphereSphereCollisionAlgorithm::processCollision
          (btSphereSphereCollisionAlgorithm *this,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btCollisionShape *pbVar1;
  btCollisionShape *pbVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btScalar len;
  btVector3 normalOnSurfaceB;
  btVector3 diff;
  btVector3 pos1;
  btScalar local_7c;
  btScalar local_78 [4];
  undefined1 local_68 [16];
  btVector3 local_50;
  btVector3 local_40;
  btScalar local_30 [4];
  
  if (this->m_manifoldPtr != (btPersistentManifold *)0x0) {
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pbVar1 = col0Wrap->m_shape;
    pbVar2 = col1Wrap->m_shape;
    local_50 = operator-(&col0Wrap->m_worldTransform->m_origin,&col1Wrap->m_worldTransform->m_origin
                        );
    local_7c = btVector3::length(&local_50);
    fVar7 = *(float *)&pbVar2[1].field_0xc * *(float *)&pbVar2->field_0x1c;
    fVar6 = *(float *)&pbVar1[1].field_0xc * *(float *)&pbVar1->field_0x1c + fVar7;
    if (local_7c <= fVar6) {
      fVar3 = 1.0;
      fVar4 = 0.0;
      local_78 = (btScalar  [4])ZEXT816(0x3f800000);
      fVar5 = 0.0;
      fVar6 = local_7c - fVar6;
      if (1.1920929e-07 < local_7c) {
        local_68 = ZEXT416((uint)fVar7);
        local_78 = (btScalar  [4])operator/(&local_50,&local_7c);
        fVar5 = local_78[2];
        fVar3 = local_78[0];
        fVar4 = local_78[1];
        fVar7 = (float)local_68._0_4_;
      }
      local_40.m_floats[1] = fVar7 * fVar4;
      local_40.m_floats[0] = fVar7 * fVar3;
      local_40.m_floats[2] = fVar5 * fVar7;
      local_40.m_floats[3] = 0.0;
      local_30 = (btScalar  [4])operator+(&col1Wrap->m_worldTransform->m_origin,&local_40);
      (*(resultOut->super_Result)._vptr_Result[4])(fVar6,resultOut,local_78);
    }
    btManifoldResult::refreshContactPoints(resultOut);
  }
  return;
}

Assistant:

void btSphereSphereCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)dispatchInfo;

	if (!m_manifoldPtr)
		return;

	resultOut->setPersistentManifold(m_manifoldPtr);

	btSphereShape* sphere0 = (btSphereShape*)col0Wrap->getCollisionShape();
	btSphereShape* sphere1 = (btSphereShape*)col1Wrap->getCollisionShape();

	btVector3 diff = col0Wrap->getWorldTransform().getOrigin()-  col1Wrap->getWorldTransform().getOrigin();
	btScalar len = diff.length();
	btScalar radius0 = sphere0->getRadius();
	btScalar radius1 = sphere1->getRadius();

#ifdef CLEAR_MANIFOLD
	m_manifoldPtr->clearManifold(); //don't do this, it disables warmstarting
#endif

	///iff distance positive, don't generate a new contact
	if ( len > (radius0+radius1))
	{
#ifndef CLEAR_MANIFOLD
		resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD
		return;
	}
	///distance (negative means penetration)
	btScalar dist = len - (radius0+radius1);

	btVector3 normalOnSurfaceB(1,0,0);
	if (len > SIMD_EPSILON)
	{
		normalOnSurfaceB = diff / len;
	}

	///point on A (worldspace)
	///btVector3 pos0 = col0->getWorldTransform().getOrigin() - radius0 * normalOnSurfaceB;
	///point on B (worldspace)
	btVector3 pos1 = col1Wrap->getWorldTransform().getOrigin() + radius1* normalOnSurfaceB;

	/// report a contact. internally this will be kept persistent, and contact reduction is done
	
	
	resultOut->addContactPoint(normalOnSurfaceB,pos1,dist);

#ifndef CLEAR_MANIFOLD
	resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD

}